

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  local_iterator it;
  local_iterator it_00;
  local_iterator it_01;
  local_iterator it_02;
  bool bVar1;
  const_nonempty_iterator piVar2;
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBVar3;
  char *in_RDI;
  AssertionResult gtest_ar__2;
  const_local_iterator e2;
  const_local_iterator b2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  const_local_iterator e;
  const_local_iterator b;
  size_type bucknum;
  key_type *in_stack_fffffffffffffb68;
  const_iterator *it_03;
  HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb70;
  const_local_iterator *this_00;
  sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  int line;
  int iVar4;
  char *file;
  Type TVar5;
  AssertHelper *this_02;
  undefined8 in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffbd8;
  char *in_stack_fffffffffffffbe0;
  AssertionResult *in_stack_fffffffffffffbe8;
  AssertHelper *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc10;
  const_iterator *local_3e0;
  const_local_iterator *pcStack_3d8;
  char *pcStack_3c8;
  undefined8 local_3c0;
  char *pcStack_3b8;
  undefined8 local_3b0;
  AssertHelper *pAStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  value_type *in_stack_fffffffffffffca8;
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffcb0;
  const_local_iterator *pcStack_338;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  string local_2a0 [55];
  undefined1 local_269;
  AssertionResult local_268 [5];
  string local_210 [71];
  undefined1 local_1c9;
  AssertionResult local_1c8;
  const_iterator *local_1b8;
  const_local_iterator *pcStack_1b0;
  undefined8 local_1a8;
  int iStack_1a4;
  sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psStack_1a0;
  undefined8 local_198;
  char *pcStack_190;
  undefined8 local_188;
  AssertHelper *pAStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  const_local_iterator *pcStack_110;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  key_type local_74;
  size_type local_70;
  value_type local_c;
  
  piVar2 = (const_nonempty_iterator)(in_RDI + 0x10);
  local_c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20)
                          );
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  pBVar3 = (BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)(in_RDI + 0x10);
  local_74 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
  local_70 = google::
             BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffc10,CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  it.super_local_iterator.pos.row_begin._M_current._0_4_ = (int)local_f8;
  it.super_local_iterator.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_100;
  it.super_local_iterator.pos.row_begin._M_current._4_4_ = (int)((ulong)local_f8 >> 0x20);
  it.super_local_iterator.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       uStack_f0;
  it.super_local_iterator.pos.row_current._M_current._0_4_ = (int)local_e8;
  it.super_local_iterator.pos.row_current._M_current._4_4_ = (int)((ulong)local_e8 >> 0x20);
  it.super_local_iterator.pos.col_current = (const_nonempty_iterator)uStack_e0;
  it.super_local_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_d8;
  it.super_local_iterator.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       uStack_d0;
  it.super_local_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffbb8;
  it.super_local_iterator.end.col_current = piVar2;
  it.parent_ = pBVar3;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(pcStack_110,it);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffc10,CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  TVar5 = (Type)((ulong)local_188 >> 0x20);
  line = (int)((ulong)local_198 >> 0x20);
  it_00.super_local_iterator.pos.row_begin._M_current._0_4_ = (int)local_198;
  it_00.super_local_iterator.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)psStack_1a0;
  it_00.super_local_iterator.pos.row_begin._M_current._4_4_ = line;
  it_00.super_local_iterator.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       pcStack_190;
  it_00.super_local_iterator.pos.row_current._M_current._0_4_ = (int)local_188;
  it_00.super_local_iterator.pos.row_current._M_current._4_4_ = TVar5;
  it_00.super_local_iterator.pos.col_current = (const_nonempty_iterator)pAStack_180;
  it_00.super_local_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_178;
  it_00.super_local_iterator.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       uStack_170;
  it_00.super_local_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffbb8;
  it_00.super_local_iterator.end.col_current = piVar2;
  it_00.parent_ = pBVar3;
  iVar4 = iStack_1a4;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(pcStack_1b0,it_00);
  local_1c9 = google::
              sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&pcStack_1b0->super_const_local_iterator,local_1b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)pcStack_1b0,(bool *)local_1b8,(type *)0xad9828);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
  it_03 = local_1b8;
  this_00 = pcStack_1b0;
  this_01 = psStack_1a0;
  file = pcStack_190;
  this_02 = pAStack_180;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_RDI)
    ;
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (pAStack_180,TVar5,pcStack_190,line,(char *)psStack_1a0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pcStack_1b0);
    std::__cxx11::string::~string(local_210);
    testing::Message::~Message((Message *)0xad98e9);
    it_03 = local_1b8;
    this_00 = pcStack_1b0;
    this_01 = psStack_1a0;
    file = pcStack_190;
    this_02 = pAStack_180;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xad997d);
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++(this_01,iVar4);
  local_269 = google::
              sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&this_00->super_const_local_iterator,it_03);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)it_03,(type *)0xad99cb);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_RDI)
    ;
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_02,TVar5,file,line,(char *)this_01);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_2a0);
    testing::Message::~Message((Message *)0xad9a9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xad9b35);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffc10,CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  it_01.super_local_iterator.pos.row_begin._M_current._0_4_ = (int)local_320;
  it_01.super_local_iterator.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_328;
  it_01.super_local_iterator.pos.row_begin._M_current._4_4_ = (int)((ulong)local_320 >> 0x20);
  it_01.super_local_iterator.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       uStack_318;
  it_01.super_local_iterator.pos.row_current._M_current._0_4_ = (int)local_310;
  it_01.super_local_iterator.pos.row_current._M_current._4_4_ = (int)((ulong)local_310 >> 0x20);
  it_01.super_local_iterator.pos.col_current = (const_nonempty_iterator)uStack_308;
  it_01.super_local_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_300;
  it_01.super_local_iterator.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       uStack_2f8;
  it_01.super_local_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffbb8;
  it_01.super_local_iterator.end.col_current = piVar2;
  it_01.parent_ = pBVar3;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(pcStack_338,it_01);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffc10,CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  TVar5 = (Type)((ulong)local_3b0 >> 0x20);
  iVar4 = (int)((ulong)local_3c0 >> 0x20);
  it_02.super_local_iterator.pos.row_begin._M_current._0_4_ = (int)local_3c0;
  it_02.super_local_iterator.ht =
       (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)pcStack_3c8;
  it_02.super_local_iterator.pos.row_begin._M_current._4_4_ = iVar4;
  it_02.super_local_iterator.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       pcStack_3b8;
  it_02.super_local_iterator.pos.row_current._M_current._0_4_ = (int)local_3b0;
  it_02.super_local_iterator.pos.row_current._M_current._4_4_ = TVar5;
  it_02.super_local_iterator.pos.col_current = (const_nonempty_iterator)pAStack_3a8;
  it_02.super_local_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_3a0;
  it_02.super_local_iterator.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       uStack_398;
  it_02.super_local_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffbb8;
  it_02.super_local_iterator.end.col_current = piVar2;
  it_02.parent_ = pBVar3;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_local_iterator::const_local_iterator(pcStack_3d8,it_02);
  google::
  sparse_hashtable_const_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator==(&pcStack_3d8->super_const_local_iterator,local_3e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)pcStack_3d8,(bool *)local_3e0,(type *)0xad9c46);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffc10);
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_3a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_RDI)
    ;
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(pAStack_3a8,TVar5,pcStack_3b8,iVar4,pcStack_3c8);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pcStack_3d8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
    testing::Message::~Message((Message *)0xad9d10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xad9d9b);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ConstLocalIterators) {
  this->ht_.insert(this->UniqueObject(1));
  const typename TypeParam::size_type bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  typename TypeParam::const_local_iterator b = this->ht_.begin(bucknum);
  typename TypeParam::const_local_iterator e = this->ht_.end(bucknum);
  EXPECT_TRUE(b != e);
  b++;
  EXPECT_TRUE(b == e);
  typename TypeParam::const_local_iterator b2 = this->ht_.begin(bucknum ^ 1);
  typename TypeParam::const_local_iterator e2 = this->ht_.end(bucknum ^ 1);
  EXPECT_TRUE(b2 == e2);
}